

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int dhm_check_range(mbedtls_mpi *param,mbedtls_mpi *P)

{
  int iVar1;
  mbedtls_mpi U;
  mbedtls_mpi L;
  mbedtls_mpi local_50;
  mbedtls_mpi local_38;
  
  mbedtls_mpi_init(&local_38);
  mbedtls_mpi_init(&local_50);
  iVar1 = mbedtls_mpi_lset(&local_38,2);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_int(&local_50,P,2), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_cmp_mpi(param,&local_38);
    if ((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(param,&local_50), 0 < iVar1)) {
      iVar1 = -0x3080;
    }
    else {
      iVar1 = 0;
    }
  }
  mbedtls_mpi_free(&local_38);
  mbedtls_mpi_free(&local_50);
  return iVar1;
}

Assistant:

static int dhm_check_range( const mbedtls_mpi *param, const mbedtls_mpi *P )
{
    mbedtls_mpi L, U;
    int ret = 0;

    mbedtls_mpi_init( &L ); mbedtls_mpi_init( &U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &L, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &U, P, 2 ) );

    if( mbedtls_mpi_cmp_mpi( param, &L ) < 0 ||
        mbedtls_mpi_cmp_mpi( param, &U ) > 0 )
    {
        ret = MBEDTLS_ERR_DHM_BAD_INPUT_DATA;
    }

cleanup:
    mbedtls_mpi_free( &L ); mbedtls_mpi_free( &U );
    return( ret );
}